

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

int av1_encode(AV1_COMP *cpi,uint8_t *dest,size_t dest_size,EncodeFrameInput *frame_input,
              EncodeFrameParams *frame_params,size_t *frame_size)

{
  double *pdVar1;
  uint *puVar2;
  uint8_t uVar3;
  aom_tune_metric aVar4;
  aom_bit_depth_t bit_depth;
  aom_superres_mode aVar5;
  AV1_PRIMARY *pAVar6;
  FIRSTPASS_STATS *pFVar7;
  SequenceHeader *pSVar8;
  RefCntBuffer *pRVar9;
  uint8_t *puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined6 uVar14;
  bool bVar15;
  _Bool _Var16;
  DELTAQ_MODE DVar17;
  uint8_t uVar18;
  int this_index;
  int iVar19;
  uint uVar20;
  int64_t iVar21;
  long lVar22;
  byte bVar23;
  int64_t *rate;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  int *piVar27;
  PSNR_STATS *sse;
  AV1_COMMON *cm;
  YV12_BUFFER_CONFIG *pYVar28;
  SequenceHeader *pSVar29;
  byte bVar30;
  bool bVar31;
  undefined1 uVar32;
  double dVar33;
  double dVar34;
  int largest_tile_id;
  uint8_t *local_1a8;
  int largest_tile_id2;
  AV1_COMMON *local_198;
  SequenceHeader *local_190;
  uint local_184;
  int64_t rate2;
  int64_t sse2;
  int largest_tile_id1;
  size_t local_168;
  int64_t rate1;
  int64_t sse1;
  ulong local_150;
  int64_t local_148;
  int64_t local_140;
  int largest_tile_id_1;
  int superres_largest_tile_ids [8];
  PSNR_STATS psnr;
  
  pYVar28 = frame_input->source;
  cpi->unscaled_source = pYVar28;
  cpi->source = pYVar28;
  cpi->unscaled_last_source = frame_input->last_source;
  (cpi->common).current_frame.refresh_frame_flags = frame_params->refresh_frame_flags;
  bVar30 = frame_params->error_resilient_mode != 0;
  (cpi->common).features.error_resilient_mode = (_Bool)bVar30;
  (cpi->common).features.primary_ref_frame = frame_params->primary_ref_frame;
  bVar23 = frame_params->frame_type;
  (cpi->common).current_frame.frame_type = bVar23;
  (cpi->common).show_frame = frame_params->show_frame;
  cpi->ref_frame_flags = frame_params->ref_frame_flags;
  cpi->speed = frame_params->speed;
  (cpi->common).show_existing_frame = frame_params->show_existing_frame;
  cpi->existing_fb_idx_to_show = frame_params->existing_fb_idx_to_show;
  uVar11 = *(undefined8 *)(frame_params->remapped_ref_idx + 2);
  uVar12 = *(undefined8 *)(frame_params->remapped_ref_idx + 4);
  uVar13 = *(undefined8 *)(frame_params->remapped_ref_idx + 6);
  *(undefined8 *)(cpi->common).remapped_ref_idx = *(undefined8 *)frame_params->remapped_ref_idx;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 2) = uVar11;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 4) = uVar12;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 6) = uVar13;
  _Var16 = (frame_params->refresh_frame).bwd_ref_frame;
  (cpi->refresh_frame).golden_frame = (frame_params->refresh_frame).golden_frame;
  (cpi->refresh_frame).bwd_ref_frame = _Var16;
  (cpi->refresh_frame).alt_ref_frame = (frame_params->refresh_frame).alt_ref_frame;
  pAVar6 = cpi->ppi;
  if (bVar23 == 0) {
    uVar25 = (ulong)cpi->gf_frame_index;
    if ((pAVar6->gf_group).refbuf_state[uVar25] == '\0') {
      (cpi->common).current_frame.frame_number = 0;
    }
  }
  else {
    uVar25 = (ulong)cpi->gf_frame_index;
  }
  uVar26 = frame_params->order_offset + (cpi->common).current_frame.frame_number;
  (cpi->common).current_frame.display_order_hint = uVar26;
  local_190 = (cpi->common).seq_params;
  (cpi->common).current_frame.order_hint =
       ~(-1 << ((char)(local_190->order_hint_info).order_hint_bits_minus_1 + 1U & 0x1f)) & uVar26;
  uVar20 = 1;
  if (uVar26 != 0) {
    uVar26 = (pAVar6->gf_group).layer_depth[uVar25];
    if (uVar26 == 6) {
      uVar20 = (pAVar6->gf_group).max_layer_depth;
    }
    else if ((uVar26 != 7) && (1 < (int)uVar26)) {
      uVar20 = uVar26;
    }
  }
  (cpi->common).current_frame.pyramid_level = uVar20;
  if (((cpi->oxcf).pass == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) {
    if ((cpi->oxcf).q_cfg.use_fixed_qp_offsets != 0) {
      av1_noop_first_pass_frame(cpi,frame_input->ts_duration);
      return 0;
    }
    av1_first_pass(cpi,frame_input->ts_duration);
    return 0;
  }
  (cpi->td).mb.e_mbd.cur_buf = pYVar28;
  pFVar7 = ((pAVar6->twopass).stats_buf_ctx)->total_stats;
  local_1a8 = dest;
  iVar19 = is_one_pass_rt_params(cpi);
  if (((iVar19 == 0) && ((cpi->oxcf).q_cfg.deltaq_mode == '\x02')) &&
     (pdVar1 = &pFVar7->frame_avg_wavelet_energy, *pdVar1 <= 0.0 && *pdVar1 != 0.0)) {
    piVar27 = &cpi->initial_mbs;
    if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
      piVar27 = &(cpi->common).mi_params.MBs;
    }
    pYVar28 = cpi->unfiltered_source;
    lVar22 = (ulong)(cpi->is_screen_content_type == 0) * 3;
    bVar23 = block_size_wide[lVar22 + 3];
    bVar30 = block_size_high[lVar22 + 3];
    local_198 = (AV1_COMMON *)(double)*piVar27;
    iVar21 = av1_haar_ac_sad_mxn_uint8_input
                       ((pYVar28->field_5).field_0.y_buffer,(pYVar28->field_4).field_0.y_stride,
                        pYVar28->flags & 8,
                        (uint)(bVar30 >> 3) *
                        ((int)((uint)bVar30 + (pYVar28->field_3).field_0.y_crop_height + -1) /
                        (int)(uint)bVar30),
                        (uint)(bVar23 >> 3) *
                        ((int)((uint)bVar23 + (pYVar28->field_2).field_0.y_crop_width + -1) /
                        (int)(uint)bVar23));
    dVar33 = log1p((double)iVar21 / (double)local_198);
    (cpi->twopass_frame).frame_avg_haar_energy = dVar33;
    bVar23 = (cpi->common).current_frame.frame_type;
    bVar30 = (cpi->common).features.error_resilient_mode;
  }
  pSVar29 = local_190;
  ((cpi->common).cur_frame)->frame_type = bVar23;
  _Var16 = (cpi->oxcf).tile_cfg.enable_large_scale_tile;
  (cpi->common).tiles.large_scale = (uint)_Var16;
  (cpi->common).tiles.single_tile_decoding = (uint)(cpi->oxcf).tile_cfg.enable_single_tile_decoding;
  bVar31 = false;
  if ((((bVar30 & 1) == 0) &&
      (pSVar8 = (cpi->common).seq_params, (pSVar8->order_hint_info).enable_ref_frame_mvs != 0)) &&
     ((pSVar8->order_hint_info).enable_order_hint != 0)) {
    bVar31 = (bVar23 & 0xfd) != 0;
  }
  cm = &cpi->common;
  (cpi->common).features.allow_ref_frame_mvs =
       ((cpi->common).features.allow_ref_frame_mvs & bVar31) != 0 && _Var16 == false;
  if (((bVar30 | ~(cpi->oxcf).motion_mode_cfg.allow_warped_motion) & 1) == 0 && (bVar23 & 0xfd) != 0
     ) {
    (cpi->common).features.allow_warped_motion =
         ((cpi->common).seq_params)->enable_warped_motion != '\0';
    cpi->last_frame_type = bVar23;
LAB_001a443e:
    if (bVar23 == 3) {
      (cpi->ppi->gf_group).update_type[(cpi->ppi->gf_group).size] = '\x02';
    }
  }
  else {
    (cpi->common).features.allow_warped_motion = false;
    cpi->last_frame_type = bVar23;
    if ((bVar23 & 0xfd) != 0) goto LAB_001a443e;
    cpi->frames_since_last_update = 0;
  }
  local_198 = cm;
  iVar19 = encode_show_existing_frame(cm);
  if (iVar19 == 0) {
    if ((((cpi->oxcf).pass == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) ||
       (((cpi->common).features.allow_screen_content_tools != true ||
        ((((cm->current_frame).frame_type & 0xfd) == 0 || ((cpi->sf).rt_sf.use_nonrd_pick_mode != 0)
         ))))) {
LAB_001a44d4:
      (cpi->common).features.cur_frame_force_integer_mv = false;
      bVar15 = false;
    }
    else {
      uVar18 = ((cpi->common).seq_params)->force_integer_mv;
      if (uVar18 == '\x02') {
        if (cpi->unscaled_last_source == (YV12_BUFFER_CONFIG *)0x0) goto LAB_001a44d4;
        iVar19 = av1_is_integer_mv(cpi->source,cpi->unscaled_last_source,&cpi->force_intpel_info);
        bVar31 = iVar19 == 0;
      }
      else {
        bVar31 = uVar18 == '\0';
      }
      bVar15 = !bVar31;
      (cpi->common).features.cur_frame_force_integer_mv = !bVar31;
    }
    (cpi->td).mb.e_mbd.cur_frame_force_integer_mv = (uint)bVar15;
    (cpi->common).lf.mode_ref_delta_update = '\0';
    bVar23 = (cpi->common).current_frame.frame_type;
    if (((bVar23 < 4) && (bVar23 != 1)) &&
       (av1_reset_segment_features(cm), (cpi->common).seg.enabled != '\0')) {
      (cpi->common).seg.update_map = '\x01';
      (cpi->common).seg.update_data = '\x01';
    }
    if ((cpi->oxcf).tile_cfg.mtu == 0) {
      uVar20 = (cpi->oxcf).tile_cfg.num_tile_groups;
    }
    else {
      uVar20 = 1;
    }
    cpi->num_tg = uVar20;
    if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
       ((cpi->oxcf).rc_cfg.mode == AOM_CBR)) {
      if (((0 < (cpi->svc).spatial_layer_id) && ((cpi->oxcf).rc_cfg.target_bandwidth == 0)) ||
         (iVar19 = av1_rc_drop_frame(cpi), iVar19 != 0)) {
        cpi->is_dropped_frame = true;
LAB_001a475c:
        av1_setup_frame_size(cpi);
        av1_set_mv_search_params(cpi);
        av1_rc_postencode_update_drop_frame(cpi);
        release_scaled_references(cpi);
        (cpi->ppi->gf_group).is_frame_dropped[cpi->gf_frame_index] = true;
        if ((cpi->common).show_frame == 0) {
          return 0;
        }
        (cpi->frame_index_set).show_frame_count = (cpi->frame_index_set).show_frame_count + 1;
        puVar2 = &(cpi->common).current_frame.frame_number;
        *puVar2 = *puVar2 + 1;
        return 0;
      }
      if ((cpi->is_dropped_frame & 1U) != 0) goto LAB_001a475c;
    }
    aVar4 = (cpi->oxcf).tune_cfg.tuning;
    if ((aVar4 < (AOM_TUNE_BUTTERAUGLI|AOM_TUNE_VMAF_WITH_PREPROCESSING)) &&
       ((0xc02U >> (aVar4 & 0x1f) & 1) != 0)) {
      av1_set_mb_ssim_rdmult_scaling(cpi);
    }
    DVar17 = (cpi->oxcf).q_cfg.deltaq_mode;
    if (DVar17 == '\x03') {
      if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
        av1_init_mb_wiener_var_buffer(cpi);
        av1_set_mb_wiener_variance(cpi);
        DVar17 = (cpi->oxcf).q_cfg.deltaq_mode;
        goto LAB_001a486c;
      }
    }
    else {
LAB_001a486c:
      if (DVar17 == '\x04') {
        av1_init_mb_ur_var_buffer(cpi);
        av1_set_mb_ur_variance(cpi);
      }
    }
    if (pSVar29->frame_id_numbers_present_flag != '\0') {
      iVar19 = (cpi->common).current_frame_id;
      if (iVar19 == -1) {
        puVar10 = (cpi->source->field_5).buffers[0];
        if ((cpi->source->flags & 8) == 0) {
          uVar18 = *puVar10;
          uVar3 = puVar10[1];
        }
        else {
          uVar18 = *(uint8_t *)((long)puVar10 * 2);
          uVar3 = *(uint8_t *)((long)puVar10 * 2 + 2);
        }
        iVar24 = 0x37;
        if ((cpi->oxcf).kf_cfg.sframe_dist == 0) {
          iVar24 = (int)((long)(ulong)CONCAT11(uVar3,uVar18) %
                        (long)(1 << ((byte)pSVar29->frame_id_length & 0x1f)));
        }
      }
      else {
        iVar24 = 1 << ((byte)pSVar29->frame_id_length & 0x1f);
        iVar24 = (iVar19 + iVar24 + 1) % iVar24;
      }
      (cpi->common).current_frame_id = iVar24;
    }
    uVar18 = (cpi->oxcf).algo_cfg.cdf_update_mode;
    uVar32 = true;
    if (uVar18 == '\0') {
LAB_001a495b:
      (cpi->common).features.disable_cdf_update = (_Bool)uVar32;
    }
    else {
      if (uVar18 == '\x02') {
        if (((cpi->oxcf).mode & 0xfd) == 0) {
          if (((cm->current_frame).frame_type & 0xfd) == 0) {
LAB_001a4959:
            uVar32 = false;
          }
          else {
            uVar32 = (cpi->common).show_frame != 0;
          }
        }
        else {
LAB_001a494f:
          iVar19 = selective_disable_cdf_rtc(cpi);
          uVar32 = (undefined1)iVar19;
        }
        goto LAB_001a495b;
      }
      if (uVar18 == '\x01') {
        if ((((cpi->sf).rt_sf.disable_cdf_update_non_reference_frame != true) ||
            ((cpi->ppi->rtc_ref).non_reference_frame == 0)) || ((cpi->rc).frames_since_key < 3)) {
          if ((cpi->sf).rt_sf.selective_cdf_update == 0) goto LAB_001a4959;
          goto LAB_001a494f;
        }
        goto LAB_001a495b;
      }
    }
    if ((cpi->do_frame_data_update == false) &&
       ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] == '\x06')) {
      (cpi->common).features.disable_cdf_update = true;
    }
    if (((cpi->oxcf).tool_cfg.enable_global_motion == true) &&
       (((cm->current_frame).frame_type & 0xfd) != 0)) {
      aom_invalidate_pyramid(cpi->source->y_pyramid);
      av1_invalidate_corner_list(cpi->source->corners);
    }
    largest_tile_id = 0;
    iVar19 = av1_superres_in_recode_allowed(cpi);
    if (iVar19 == 0) {
      aVar5 = cpi->superres_mode;
      cpi->superres_mode = (cpi->oxcf).superres_cfg.superres_mode;
      iVar19 = encode_with_recode_loop_and_filter
                         (cpi,frame_size,local_1a8,dest_size,(int64_t *)0x0,(int64_t *)0x0,
                          &largest_tile_id);
      if (iVar19 == 0) {
        cpi->superres_mode = aVar5;
LAB_001a4bbd:
        if (pSVar29->frame_id_numbers_present_flag != '\0') {
          uVar20 = (cpi->common).current_frame.refresh_frame_flags;
          for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
            if ((uVar20 >> ((uint)lVar22 & 0x1f) & 1) != 0) {
              (cpi->common).ref_frame_id[lVar22] = (cpi->common).current_frame_id;
            }
          }
        }
        if ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1) {
          piVar27 = &(cpi->svc).num_encoded_top_layer;
          *piVar27 = *piVar27 + 1;
        }
        if ((((cpi->common).seg.enabled != '\0') && ((cpi->common).seg.update_map == '\0')) &&
           (puVar10 = (cpi->common).last_frame_seg_map, puVar10 != (uint8_t *)0x0)) {
          pRVar9 = (cpi->common).cur_frame;
          memcpy(pRVar9->seg_map,puVar10,(long)pRVar9->mi_rows * (long)pRVar9->mi_cols);
        }
        if (((cpi->ppi->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
           (((cm->current_frame).frame_type & 0xfd) != 0)) {
          release_scaled_references(cpi);
        }
        if ((cpi->common).show_frame != 0) {
          cpi->last_show_frame_buf = (cpi->common).cur_frame;
        }
        if ((cpi->common).features.refresh_frame_context == '\x01') {
          memcpy((cpi->common).fc,&cpi->tile_data[largest_tile_id].tctx,0x52fc);
          av1_reset_cdf_symbol_counters((cpi->common).fc);
        }
        if ((cpi->common).tiles.large_scale == 0) {
          memcpy(&((cpi->common).cur_frame)->frame_context,(cpi->common).fc,0x52fc);
        }
        if ((((cpi->oxcf).tile_cfg.enable_ext_tile_debug == true) &&
            ((cpi->common).tiles.large_scale != 0)) &&
           (iVar19 = is_stat_consumption_stage(cpi), iVar19 != 0)) {
          psnr.psnr[1] = 0.0;
          psnr.psnr[2]._0_4_ = 0;
          uVar20 = (cpi->common).current_frame.frame_number;
          psnr.psnr[0]._0_5_ = CONCAT14((char)((ulong)uVar20 / 100) + '0',0x63662f2e);
          uVar14 = CONCAT15((char)((ushort)((ulong)uVar20 % 100) / 10),psnr.psnr[0]._0_5_);
          psnr.psnr[0] = (double)(ulong)(CONCAT16((char)((ulong)uVar20 % 10),uVar14) |
                                        0x30300000000000);
          av1_print_frame_contexts((cpi->common).fc,(char *)&psnr);
        }
        _Var16 = (cpi->common).features.disable_cdf_update;
        cpi->last_frame_type = (cpi->common).current_frame.frame_type;
        if (_Var16 == true) {
          iVar19 = cpi->frames_since_last_update + 1;
        }
        else {
          iVar19 = 1;
        }
        cpi->frames_since_last_update = iVar19;
        iVar19 = (cpi->svc).number_spatial_layers;
        if ((cpi->svc).spatial_layer_id == iVar19 + -1) {
          (cpi->svc).prev_number_spatial_layers = iVar19;
        }
        (cpi->svc).prev_number_temporal_layers = (cpi->svc).number_temporal_layers;
        (cpi->common).seg.update_map = '\0';
        (cpi->common).seg.update_data = '\0';
        (cpi->common).lf.mode_ref_delta_update = '\0';
        bVar31 = false;
        if ((cpi->common).show_frame != 0) {
          (cpi->frame_index_set).show_frame_count = (cpi->frame_index_set).show_frame_count + 1;
          puVar2 = &(cpi->common).current_frame.frame_number;
          *puVar2 = *puVar2 + 1;
          bVar31 = false;
        }
        goto LAB_001a46ec;
      }
    }
    else {
      av1_save_all_coding_context(cpi);
      puVar10 = local_1a8;
      largest_tile_id1 = 0;
      sse1 = 0x7fffffffffffffff;
      rate1 = 0x7fffffffffffffff;
      sse2 = 0x7fffffffffffffff;
      rate2 = 0x7fffffffffffffff;
      bVar23 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
      bit_depth = ((cpi->common).seq_params)->bit_depth;
      local_184 = (uint)bVar23;
      if ((cpi->sf).hl_sf.superres_auto_search_type == '\0') {
        local_150 = (ulong)bit_depth;
        if ((byte)(bVar23 - 6) < 0xfe) {
          piVar27 = superres_largest_tile_ids;
          rate = (int64_t *)&largest_tile_id_1;
          sse = &psnr;
          local_168 = dest_size;
          for (lVar22 = -8; lVar22 != 0; lVar22 = lVar22 + 1) {
            uVar18 = (char)lVar22 + '\x11';
            (cpi->oxcf).superres_cfg.superres_scale_denominator = uVar18;
            (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = uVar18;
            cpi->superres_mode = AOM_SUPERRES_AUTO;
            iVar19 = encode_with_recode_loop_and_filter
                               (cpi,frame_size,local_1a8,local_168,(int64_t *)sse,rate,piVar27);
            cpi->superres_mode = AOM_SUPERRES_NONE;
            if (iVar19 != 0) goto LAB_001a449d;
            restore_all_coding_context(cpi);
            piVar27 = piVar27 + 1;
            rate = rate + 1;
            sse = (PSNR_STATS *)(sse->psnr + 1);
          }
          (cpi->oxcf).superres_cfg.superres_scale_denominator = '\b';
          (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = '\b';
          dest_size = local_168;
        }
        else {
          for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
            psnr.psnr[lVar22] = NAN;
            (&largest_tile_id_1 + lVar22 * 2)[0] = -1;
            (&largest_tile_id_1 + lVar22 * 2)[1] = 0x7fffffff;
            superres_largest_tile_ids[lVar22] = 0;
          }
        }
        iVar19 = encode_with_recode_loop_and_filter
                           (cpi,frame_size,local_1a8,dest_size,&sse2,&rate2,&largest_tile_id2);
        uVar25 = local_150;
        if (iVar19 == 0) {
          iVar19 = av1_compute_rd_mult_based_on_qindex
                             ((aom_bit_depth_t)local_150,(FRAME_UPDATE_TYPE)local_184,
                              (cpi->common).quant_params.base_qindex,(cpi->oxcf).tune_cfg.tuning);
          cm = local_198;
          bVar23 = (char)uVar25 * '\x02' - 0x10;
          dVar33 = 1.79769313486232e+308;
          uVar18 = 0xff;
          for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
            dVar34 = (double)((long)psnr.psnr[lVar22] >> (bVar23 & 0x3f)) * 128.0 +
                     (double)*(long *)(&largest_tile_id_1 + lVar22 * 2) * (double)iVar19 *
                     0.001953125;
            uVar3 = (char)lVar22 + '\t';
            if (dVar33 <= dVar34) {
              dVar34 = dVar33;
              uVar3 = uVar18;
            }
            uVar18 = uVar3;
            dVar33 = dVar34;
          }
          if ((double)(sse2 >> (bVar23 & 0x3f)) * 128.0 +
              (double)iVar19 * (double)rate2 * 0.001953125 <= dVar33) {
            largest_tile_id = largest_tile_id2;
            iVar19 = 0;
          }
          else {
            restore_all_coding_context(cpi);
            (cpi->oxcf).superres_cfg.superres_scale_denominator = uVar18;
            (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = uVar18;
            cpi->superres_mode = AOM_SUPERRES_AUTO;
            iVar19 = encode_with_recode_loop_and_filter
                               (cpi,frame_size,local_1a8,dest_size,&local_140,&local_148,
                                &largest_tile_id);
            cpi->superres_mode = AOM_SUPERRES_NONE;
            (cpi->oxcf).superres_cfg.superres_scale_denominator = '\b';
            (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = '\b';
          }
LAB_001a502a:
          pSVar29 = local_190;
          if (iVar19 == 0) goto LAB_001a4bbd;
        }
      }
      else {
        cpi->superres_mode = AOM_SUPERRES_AUTO;
        iVar19 = encode_with_recode_loop_and_filter
                           (cpi,frame_size,local_1a8,dest_size,&sse1,&rate1,&largest_tile_id1);
        cpi->superres_mode = AOM_SUPERRES_NONE;
        if (iVar19 == 0) {
          restore_all_coding_context(cpi);
          iVar19 = encode_with_recode_loop_and_filter
                             (cpi,frame_size,puVar10,dest_size,&sse2,&rate2,&largest_tile_id2);
          if (iVar19 == 0) {
            iVar19 = av1_compute_rd_mult_based_on_qindex
                               (bit_depth,(FRAME_UPDATE_TYPE)local_184,
                                (cpi->common).quant_params.base_qindex,(cpi->oxcf).tune_cfg.tuning);
            bVar23 = (char)bit_depth * '\x02' - 0x10;
            if ((double)(sse2 >> (bVar23 & 0x3f)) * 128.0 +
                (double)rate2 * (double)iVar19 * 0.001953125 <=
                (double)(sse1 >> (bVar23 & 0x3f)) * 128.0 +
                (double)rate1 * (double)iVar19 * 0.001953125) {
              largest_tile_id = largest_tile_id2;
              pSVar29 = local_190;
              goto LAB_001a4bbd;
            }
            restore_all_coding_context(cpi);
            cpi->superres_mode = AOM_SUPERRES_AUTO;
            iVar19 = encode_with_recode_loop_and_filter
                               (cpi,frame_size,local_1a8,dest_size,(int64_t *)&psnr,
                                (int64_t *)&largest_tile_id_1,&largest_tile_id);
            cpi->superres_mode = AOM_SUPERRES_NONE;
            goto LAB_001a502a;
          }
        }
      }
    }
  }
  else {
    av1_finalize_encoded_frame(cpi);
    largest_tile_id_1 = 0;
    (cpi->rc).coefficient_size = 0;
    iVar19 = av1_pack_bitstream(cpi,local_1a8,dest_size,frame_size,&largest_tile_id_1);
    if (iVar19 == 0) {
      if ((pSVar29->frame_id_numbers_present_flag != '\0') &&
         ((cm->current_frame).frame_type == '\0')) {
        iVar19 = (cpi->common).ref_frame_id[cpi->existing_fb_idx_to_show];
        for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
          (cpi->common).ref_frame_id[lVar22] = iVar19;
        }
      }
      if ((cpi->common).show_frame != 0) {
        cpi->last_show_frame_buf = (cpi->common).cur_frame;
      }
      av1_set_target_rate(cpi,(cpi->common).width,(cpi->common).height);
      iVar19 = is_psnr_calc_enabled(cpi);
      if (iVar19 != 0) {
        pRVar9 = (cpi->common).cur_frame;
        iVar19 = (pRVar9->buf).field_2.field_0.y_crop_width;
        iVar24 = (pRVar9->buf).field_3.field_0.y_crop_height;
        pSVar29 = (cpi->common).seq_params;
        uVar18 = pSVar29->monochrome;
        pYVar28 = cpi->unscaled_source;
        if (((pYVar28->field_2).field_0.y_crop_width != iVar19) ||
           ((pYVar28->field_3).field_0.y_crop_height != iVar24)) {
          pYVar28 = &cpi->scaled_source;
          iVar19 = aom_realloc_frame_buffer
                             (pYVar28,iVar19,iVar24,pSVar29->subsampling_x,pSVar29->subsampling_y,
                              (uint)pSVar29->use_highbitdepth,0x120,
                              (cpi->common).features.byte_alignment,(aom_codec_frame_buffer_t *)0x0,
                              (aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,cpi->alloc_pyramid,0);
          if (iVar19 != 0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to reallocate scaled source buffer");
          }
          _Var16 = av1_resize_and_extend_frame_nonnormative
                             (cpi->unscaled_source,pYVar28,((cpi->common).seq_params)->bit_depth,
                              (uint)(uVar18 == '\0') * 2 + 1);
          if (!_Var16) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to reallocate buffers during resize");
          }
        }
        cpi->source = pYVar28;
      }
      if (cpi->use_ducky_encode != 0) {
        aom_calc_psnr(cpi->source,&((cpi->common).cur_frame)->buf,&psnr);
        (cpi->ducky_encode_info).frame_result.global_order_idx =
             ((cpi->common).cur_frame)->display_order_hint;
        (cpi->ducky_encode_info).frame_result.q_index = (cpi->common).quant_params.base_qindex;
        (cpi->ducky_encode_info).frame_result.rdmult = (cpi->rd).RDMULT;
        (cpi->ducky_encode_info).frame_result.rate = (int)*frame_size << 3;
        (cpi->ducky_encode_info).frame_result.dist = psnr.sse[0];
        (cpi->ducky_encode_info).frame_result.psnr = psnr.psnr[0];
      }
      (cpi->frame_index_set).show_frame_count = (cpi->frame_index_set).show_frame_count + 1;
      puVar2 = &(cpi->common).current_frame.frame_number;
      *puVar2 = *puVar2 + 1;
      bVar31 = false;
      goto LAB_001a46ec;
    }
  }
LAB_001a449d:
  bVar31 = true;
LAB_001a46ec:
  if (!bVar31) {
    return 0;
  }
  return 1;
}

Assistant:

int av1_encode(AV1_COMP *const cpi, uint8_t *const dest, size_t dest_size,
               const EncodeFrameInput *const frame_input,
               const EncodeFrameParams *const frame_params,
               size_t *const frame_size) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;

  cpi->unscaled_source = frame_input->source;
  cpi->source = frame_input->source;
  cpi->unscaled_last_source = frame_input->last_source;

  current_frame->refresh_frame_flags = frame_params->refresh_frame_flags;
  cm->features.error_resilient_mode = frame_params->error_resilient_mode;
  cm->features.primary_ref_frame = frame_params->primary_ref_frame;
  cm->current_frame.frame_type = frame_params->frame_type;
  cm->show_frame = frame_params->show_frame;
  cpi->ref_frame_flags = frame_params->ref_frame_flags;
  cpi->speed = frame_params->speed;
  cm->show_existing_frame = frame_params->show_existing_frame;
  cpi->existing_fb_idx_to_show = frame_params->existing_fb_idx_to_show;

  memcpy(cm->remapped_ref_idx, frame_params->remapped_ref_idx,
         REF_FRAMES * sizeof(*cm->remapped_ref_idx));

  memcpy(&cpi->refresh_frame, &frame_params->refresh_frame,
         sizeof(cpi->refresh_frame));

  if (current_frame->frame_type == KEY_FRAME &&
      cpi->ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
    current_frame->frame_number = 0;
  }

  current_frame->order_hint =
      current_frame->frame_number + frame_params->order_offset;

  current_frame->display_order_hint = current_frame->order_hint;
  current_frame->order_hint %=
      (1 << (cm->seq_params->order_hint_info.order_hint_bits_minus_1 + 1));

  current_frame->pyramid_level = get_true_pyr_level(
      cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index],
      current_frame->display_order_hint, cpi->ppi->gf_group.max_layer_depth);

  if (is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
    if (cpi->oxcf.q_cfg.use_fixed_qp_offsets)
      av1_noop_first_pass_frame(cpi, frame_input->ts_duration);
    else
      av1_first_pass(cpi, frame_input->ts_duration);
#endif
  } else if (cpi->oxcf.pass == AOM_RC_ONE_PASS ||
             cpi->oxcf.pass >= AOM_RC_SECOND_PASS) {
    if (encode_frame_to_data_rate(cpi, frame_size, dest, dest_size) !=
        AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_ERROR;
  }

  return AOM_CODEC_OK;
}